

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCreateTabbingRequest(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiScrollFlags scroll_flags_00;
  ImGuiDir clip_dir_00;
  uint local_2c;
  byte local_25;
  ImGuiDir clip_dir;
  ImGuiScrollFlags scroll_flags;
  bool tab_pressed;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->NavWindow;
  if (GImGui->NavMoveDir == -1) {
    if (((pIVar1 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar1->Flags & 0x40000U) == 0)) {
      bVar3 = IsKeyPressed(0x200,true);
      local_25 = 0;
      if (bVar3) {
        bVar3 = IsActiveIdUsingKey(0x200);
        local_25 = 0;
        if ((!bVar3) && (local_25 = 0, ((pIVar2->IO).KeyCtrl & 1U) == 0)) {
          local_25 = (pIVar2->IO).KeyAlt ^ 0xff;
        }
      }
      if ((local_25 & 1) != 0) {
        if (((pIVar2->IO).KeyShift & 1U) == 0) {
          local_2c = (uint)(pIVar2->ActiveId != 0);
        }
        else {
          local_2c = 0xffffffff;
        }
        pIVar2->NavTabbingDir = local_2c;
        scroll_flags_00 = 3;
        if ((pIVar1->Appearing & 1U) != 0) {
          scroll_flags_00 = 0x21;
        }
        clip_dir_00 = 3;
        if (pIVar2->NavTabbingDir < 0) {
          clip_dir_00 = 2;
        }
        NavMoveRequestSubmit(-1,clip_dir_00,0x400,scroll_flags_00);
        ImGuiNavItemData::Clear(&pIVar2->NavTabbingResultFirst);
        pIVar2->NavTabbingCounter = -1;
      }
    }
    return;
  }
  __assert_fail("g.NavMoveDir == ImGuiDir_None",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x2b3d,"void ImGui::NavUpdateCreateTabbingRequest()");
}

Assistant:

void ImGui::NavUpdateCreateTabbingRequest()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    IM_ASSERT(g.NavMoveDir == ImGuiDir_None);
    if (window == NULL || g.NavWindowingTarget != NULL || (window->Flags & ImGuiWindowFlags_NoNavInputs))
        return;

    const bool tab_pressed = IsKeyPressed(ImGuiKey_Tab, true) && !IsActiveIdUsingKey(ImGuiKey_Tab) && !g.IO.KeyCtrl && !g.IO.KeyAlt;
    if (!tab_pressed)
        return;

    // Initiate tabbing request
    // (this is ALWAYS ENABLED, regardless of ImGuiConfigFlags_NavEnableKeyboard flag!)
    // Initially this was designed to use counters and modulo arithmetic, but that could not work with unsubmitted items (list clipper). Instead we use a strategy close to other move requests.
    // See NavProcessItemForTabbingRequest() for a description of the various forward/backward tabbing cases with and without wrapping.
    //// FIXME: We use (g.ActiveId == 0) but (g.NavDisableHighlight == false) might be righter once we can tab through anything
    g.NavTabbingDir = g.IO.KeyShift ? -1 : (g.ActiveId == 0) ? 0 : +1;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    ImGuiDir clip_dir = (g.NavTabbingDir < 0) ? ImGuiDir_Up : ImGuiDir_Down;
    NavMoveRequestSubmit(ImGuiDir_None, clip_dir, ImGuiNavMoveFlags_Tabbing, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    g.NavTabbingResultFirst.Clear();
    g.NavTabbingCounter = -1;
}